

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::PickElement::backward_impl
          (PickElement *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  Scalar *pSVar2;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_30;
  
  if (i == 0) {
    fVar1 = *dEdf->v;
    Tensor::operator*(&local_30,dEdxi);
    pSVar2 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)&local_30,(ulong)*this->pval);
    *pSVar2 = fVar1 + *pSVar2;
    return;
  }
  __assert_fail("i == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                ,0x52b,
                "virtual void cnn::PickElement::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void PickElement::backward_impl(const vector<const Tensor*>& xs,
                    const Tensor& fx,
                    const Tensor& dEdf,
                    unsigned i,
                    Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("PickElement not yet implemented for CUDA");
#else
  (*dEdxi)(*pval) += dEdf.v[0];
#endif
}